

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlemgr.cpp
# Opt level: O2

PAL_ERROR __thiscall CorUnix::CSimpleHandleManager::Initialize(CSimpleHandleManager *this)

{
  HANDLE_TABLE_ENTRY *pHVar1;
  long lVar2;
  ulong uVar3;
  
  InternalInitializeCriticalSection(&this->m_csLock);
  this->m_fLockInitialized = true;
  this->m_dwTableSize = 0x400;
  this->m_dwTableGrowthRate = 0x400;
  pHVar1 = (HANDLE_TABLE_ENTRY *)InternalMalloc(0x4000);
  this->m_rghteHandleTable = pHVar1;
  if (pHVar1 == (HANDLE_TABLE_ENTRY *)0x0) {
    if (PAL_InitializeChakraCoreCalled != false) {
      return 0xe;
    }
  }
  else {
    lVar2 = 0;
    uVar3 = 0;
    while (uVar3 < this->m_dwTableSize) {
      uVar3 = uVar3 + 1;
      *(ulong *)((long)&pHVar1->u + lVar2) = uVar3;
      pHVar1 = this->m_rghteHandleTable;
      (&pHVar1->fEntryAllocated)[lVar2] = false;
      lVar2 = lVar2 + 0x10;
    }
    pHVar1[this->m_dwTableSize - 1].u.hiNextIndex = 0xffffffffffffffff;
    this->m_hiFreeListStart = 0;
    this->m_hiFreeListEnd = (ulong)(this->m_dwTableSize - 1);
    if (PAL_InitializeChakraCoreCalled != false) {
      return 0;
    }
  }
  abort();
}

Assistant:

PAL_ERROR
CSimpleHandleManager::Initialize(
    void
    )
{
    PAL_ERROR palError = NO_ERROR;
    
    InternalInitializeCriticalSection(&m_csLock);
    m_fLockInitialized = TRUE;

    m_dwTableGrowthRate = c_BasicGrowthRate;

    /* initialize the handle table - the free list is stored in the 'object'
       field, with the head in the global 'm_hiFreeListStart'. */
    m_dwTableSize = m_dwTableGrowthRate;
    
    m_rghteHandleTable = reinterpret_cast<HANDLE_TABLE_ENTRY*>(InternalMalloc((m_dwTableSize * sizeof(HANDLE_TABLE_ENTRY))));
    if(NULL == m_rghteHandleTable)
    {
        ERROR("Unable to create initial handle table array");
        palError = ERROR_OUTOFMEMORY;
        goto InitializeExit;
    }

    for (DWORD i = 0; i < m_dwTableSize; i++)
    {
        m_rghteHandleTable[i].u.hiNextIndex = i + 1;
        m_rghteHandleTable[i].fEntryAllocated = FALSE;
    }

    m_rghteHandleTable[m_dwTableSize - 1].u.hiNextIndex = (HANDLE_INDEX)-1;
    
    m_hiFreeListStart = 0;
    m_hiFreeListEnd = m_dwTableSize - 1;

    TRACE("Handle Manager initialization complete.\n");

InitializeExit:
    
    return palError;
}